

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_jnt_convolve_avx2.c
# Opt level: O1

void av1_highbd_dist_wtd_convolve_y_avx2
               (uint16_t *src,int src_stride,uint16_t *dst0,int dst_stride0,int w,int h,
               InterpFilterParams *filter_params_y,int subpel_y_qn,ConvolveParams *conv_params,
               int bd)

{
  undefined1 (*pauVar1) [16];
  int iVar2;
  int iVar3;
  uint uVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  CONV_BUF_TYPE *pCVar7;
  int16_t *piVar8;
  undefined1 auVar9 [32];
  char cVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  uint16_t *puVar20;
  uint uVar21;
  long lVar22;
  long lVar23;
  undefined2 uVar24;
  long lVar25;
  int iVar26;
  CONV_BUF_TYPE *pCVar27;
  uint16_t *puVar28;
  int iVar29;
  long lVar30;
  ulong uVar31;
  int iVar32;
  long lVar33;
  long lVar34;
  undefined2 uVar35;
  uint16_t *puVar36;
  CONV_BUF_TYPE *pCVar37;
  uint16_t *puVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  
  iVar32 = conv_params->round_1 + conv_params->round_0;
  cVar10 = (char)bd - (char)iVar32;
  uVar24 = 0xff;
  if (bd == 0xc) {
    uVar24 = 0xfff;
  }
  uVar35 = 0x3ff;
  if (bd != 10) {
    uVar35 = uVar24;
  }
  if (0 < w) {
    pCVar7 = conv_params->dst;
    iVar29 = (1 << ((byte)conv_params->round_1 & 0x1f)) >> 1;
    uVar31 = (ulong)((subpel_y_qn & 0xfU) * (uint)filter_params_y->taps);
    lVar30 = (long)(int)(((filter_params_y->taps >> 1) - 1) * src_stride);
    auVar41 = ZEXT416(7 - conv_params->round_0);
    iVar2 = conv_params->fwd_offset;
    iVar3 = conv_params->bck_offset;
    uVar4 = conv_params->round_1;
    iVar26 = (1 << (cVar10 + 0xdU & 0x1f)) + (1 << (cVar10 + 0xeU & 0x1f));
    auVar44._4_4_ = iVar26;
    auVar44._0_4_ = iVar26;
    auVar44._8_4_ = iVar26;
    auVar44._12_4_ = iVar26;
    auVar44._16_4_ = iVar26;
    auVar44._20_4_ = iVar26;
    auVar44._24_4_ = iVar26;
    auVar44._28_4_ = iVar26;
    uVar21 = 0xe - iVar32;
    piVar8 = filter_params_y->filter_ptr;
    uVar5 = *(undefined4 *)(piVar8 + uVar31 + 6);
    auVar51._4_4_ = uVar5;
    auVar51._0_4_ = uVar5;
    auVar51._8_4_ = uVar5;
    auVar51._12_4_ = uVar5;
    auVar51._16_4_ = uVar5;
    auVar51._20_4_ = uVar5;
    auVar51._24_4_ = uVar5;
    auVar51._28_4_ = uVar5;
    uVar5 = *(undefined4 *)(piVar8 + uVar31 + 4);
    auVar53._4_4_ = uVar5;
    auVar53._0_4_ = uVar5;
    auVar53._8_4_ = uVar5;
    auVar53._12_4_ = uVar5;
    auVar53._16_4_ = uVar5;
    auVar53._20_4_ = uVar5;
    auVar53._24_4_ = uVar5;
    auVar53._28_4_ = uVar5;
    uVar5 = *(undefined4 *)(piVar8 + uVar31 + 2);
    auVar54._4_4_ = uVar5;
    auVar54._0_4_ = uVar5;
    auVar54._8_4_ = uVar5;
    auVar54._12_4_ = uVar5;
    auVar54._16_4_ = uVar5;
    auVar54._20_4_ = uVar5;
    auVar54._24_4_ = uVar5;
    auVar54._28_4_ = uVar5;
    uVar5 = *(undefined4 *)(piVar8 + uVar31);
    auVar55._4_4_ = uVar5;
    auVar55._0_4_ = uVar5;
    auVar55._8_4_ = uVar5;
    auVar55._12_4_ = uVar5;
    auVar55._16_4_ = uVar5;
    auVar55._20_4_ = uVar5;
    auVar55._24_4_ = uVar5;
    auVar55._28_4_ = uVar5;
    lVar33 = (long)conv_params->dst_stride;
    iVar32 = (1 << ((byte)uVar21 & 0x1f)) >> 1;
    auVar42._4_4_ = iVar32;
    auVar42._0_4_ = iVar32;
    auVar42._8_4_ = iVar32;
    auVar42._12_4_ = iVar32;
    auVar42._16_4_ = iVar32;
    auVar42._20_4_ = iVar32;
    auVar42._24_4_ = iVar32;
    auVar42._28_4_ = iVar32;
    iVar32 = conv_params->do_average;
    iVar26 = conv_params->use_dist_wtd_comp_avg;
    lVar22 = (long)src_stride;
    auVar42 = vpsubd_avx2(auVar42,auVar44);
    lVar25 = (long)dst_stride0;
    lVar34 = 0;
    uVar31 = 0;
    do {
      if (0 < h) {
        pauVar1 = (undefined1 (*) [16])(src + (uVar31 - lVar30));
        auVar39 = *(undefined1 (*) [16])(*pauVar1 + (long)(src_stride * 4) * 2);
        auVar6 = *(undefined1 (*) [16])(*pauVar1 + (long)(src_stride * 5) * 2);
        auVar45._0_16_ = ZEXT116(0) * auVar6 + ZEXT116(1) * auVar39;
        auVar45._16_16_ = ZEXT116(1) * auVar6;
        auVar46 = *(undefined1 (*) [16])(*pauVar1 + (long)(src_stride * 6) * 2);
        auVar52._0_16_ = ZEXT116(0) * auVar39 + ZEXT116(1) * auVar46;
        auVar52._32_32_ = in_ZMM6._32_32_;
        auVar52._16_16_ = ZEXT116(1) * auVar39;
        auVar43._0_16_ = ZEXT116(0) * auVar46 + ZEXT116(1) * auVar6;
        auVar43._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar46;
        auVar50 = vpunpckhwd_avx2(auVar45,auVar43);
        auVar6 = *(undefined1 (*) [16])(*pauVar1 + (long)(src_stride * 2) * 2);
        auVar46 = *(undefined1 (*) [16])(*pauVar1 + (long)(src_stride * 3) * 2);
        auVar56._0_16_ = ZEXT116(0) * auVar46 + ZEXT116(1) * auVar6;
        auVar56._16_16_ = ZEXT116(1) * auVar46;
        auVar58._0_16_ = ZEXT116(0) * auVar39 + ZEXT116(1) * auVar46;
        auVar58._16_16_ = ZEXT116(1) * auVar39;
        auVar9 = vpunpckhwd_avx2(auVar56,auVar58);
        auVar39 = *(undefined1 (*) [16])(*pauVar1 + lVar22 * 2);
        auVar49._0_16_ = ZEXT116(0) * auVar39 + ZEXT116(1) * *pauVar1;
        auVar49._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar39;
        auVar47._0_16_ = ZEXT116(0) * auVar6 + ZEXT116(1) * auVar39;
        auVar47._16_16_ = ZEXT116(1) * auVar6;
        auVar40 = vpunpckhwd_avx2(auVar49,auVar47);
        auVar45 = vpunpcklwd_avx2(auVar45,auVar43);
        auVar58 = vpunpcklwd_avx2(auVar56,auVar58);
        auVar43 = vpunpcklwd_avx2(auVar49,auVar47);
        lVar23 = 0;
        puVar20 = src + (src_stride * 7 - lVar30);
        pCVar27 = pCVar7;
        puVar28 = dst0;
        puVar36 = src + (src_stride * 8 - lVar30);
        pCVar37 = pCVar7 + lVar33;
        puVar38 = dst0 + lVar25;
        in_ZMM6 = auVar52;
        do {
          auVar47 = auVar50;
          auVar56 = auVar58;
          auVar58 = vpmaddwd_avx2(auVar55,auVar43);
          auVar39 = *(undefined1 (*) [16])((long)puVar20 + lVar34);
          auVar50._0_16_ = ZEXT116(0) * auVar39 + ZEXT116(1) * in_ZMM6._0_16_;
          auVar50._16_16_ = ZEXT116(0) * in_ZMM6._16_16_ + ZEXT116(1) * auVar39;
          auVar6 = *(undefined1 (*) [16])((long)puVar36 + lVar34);
          auVar57._0_16_ = ZEXT116(0) * auVar6 + ZEXT116(1) * auVar39;
          auVar57._16_16_ = ZEXT116(1) * auVar6;
          auVar49 = vpunpcklwd_avx2(auVar50,auVar57);
          auVar50 = vpunpckhwd_avx2(auVar50,auVar57);
          auVar43 = vpmaddwd_avx2(auVar54,auVar56);
          auVar58 = vpaddd_avx2(auVar43,auVar58);
          auVar43 = vpmaddwd_avx2(auVar45,auVar53);
          auVar58 = vpaddd_avx2(auVar58,auVar43);
          auVar43 = vpmaddwd_avx2(auVar49,auVar51);
          auVar58 = vpaddd_avx2(auVar58,auVar43);
          auVar58 = vpslld_avx2(auVar58,auVar41);
          auVar19._4_4_ = iVar29;
          auVar19._0_4_ = iVar29;
          auVar19._8_4_ = iVar29;
          auVar19._12_4_ = iVar29;
          auVar19._16_4_ = iVar29;
          auVar19._20_4_ = iVar29;
          auVar19._24_4_ = iVar29;
          auVar19._28_4_ = iVar29;
          auVar58 = vpaddd_avx2(auVar58,auVar19);
          auVar58 = vpsrad_avx2(auVar58,ZEXT416(uVar4));
          auVar58 = vpaddd_avx2(auVar44,auVar58);
          if ((long)((ulong)(uint)w - 8) < (long)uVar31) {
            if (iVar32 == 0) {
              auVar40 = vpackusdw_avx2(auVar58,auVar56);
              *(long *)((long)pCVar27 + lVar34) = auVar40._0_8_;
              *(long *)((long)pCVar37 + lVar34) = auVar40._16_8_;
            }
            else {
              auVar39._8_8_ = 0;
              auVar39._0_8_ = *(ulong *)((long)pCVar37 + lVar34);
              auVar46._8_8_ = 0;
              auVar46._0_8_ = *(ulong *)((long)pCVar27 + lVar34);
              auVar40._0_16_ = ZEXT116(0) * auVar39 + ZEXT116(1) * auVar46;
              auVar40._16_16_ = ZEXT116(1) * auVar39;
              auVar40 = vpunpcklwd_avx2(auVar40,_DAT_005199a0);
              if (iVar26 == 0) {
                auVar40 = vpaddd_avx2(auVar58,auVar40);
                auVar40 = vpsrad_avx2(auVar40,1);
              }
              else {
                auVar14._4_4_ = iVar2;
                auVar14._0_4_ = iVar2;
                auVar14._8_4_ = iVar2;
                auVar14._12_4_ = iVar2;
                auVar14._16_4_ = iVar2;
                auVar14._20_4_ = iVar2;
                auVar14._24_4_ = iVar2;
                auVar14._28_4_ = iVar2;
                auVar40 = vpmulld_avx2(auVar40,auVar14);
                auVar11._4_4_ = iVar3;
                auVar11._0_4_ = iVar3;
                auVar11._8_4_ = iVar3;
                auVar11._12_4_ = iVar3;
                auVar11._16_4_ = iVar3;
                auVar11._20_4_ = iVar3;
                auVar11._24_4_ = iVar3;
                auVar11._28_4_ = iVar3;
                auVar58 = vpmulld_avx2(auVar58,auVar11);
                auVar40 = vpaddd_avx2(auVar40,auVar58);
                auVar40 = vpsrad_avx2(auVar40,4);
              }
              auVar40 = vpaddd_avx2(auVar40,auVar42);
              auVar40 = vpsrad_avx2(auVar40,ZEXT416(uVar21));
              auVar40 = vpackusdw_avx2(auVar40,auVar40);
              auVar17._2_2_ = uVar35;
              auVar17._0_2_ = uVar35;
              auVar17._4_2_ = uVar35;
              auVar17._6_2_ = uVar35;
              auVar17._8_2_ = uVar35;
              auVar17._10_2_ = uVar35;
              auVar17._12_2_ = uVar35;
              auVar17._14_2_ = uVar35;
              auVar17._16_2_ = uVar35;
              auVar17._18_2_ = uVar35;
              auVar17._20_2_ = uVar35;
              auVar17._22_2_ = uVar35;
              auVar17._24_2_ = uVar35;
              auVar17._26_2_ = uVar35;
              auVar17._28_2_ = uVar35;
              auVar17._30_2_ = uVar35;
              auVar40 = vpminsw_avx2(auVar40,auVar17);
              *(long *)((long)puVar28 + lVar34) = auVar40._0_8_;
              *(long *)((long)puVar38 + lVar34) = auVar40._16_8_;
            }
          }
          else {
            auVar40 = vpmaddwd_avx2(auVar55,auVar40);
            auVar43 = vpmaddwd_avx2(auVar9,auVar54);
            auVar40 = vpaddd_avx2(auVar43,auVar40);
            auVar43 = vpmaddwd_avx2(auVar47,auVar53);
            auVar40 = vpaddd_avx2(auVar40,auVar43);
            auVar43 = vpmaddwd_avx2(auVar50,auVar51);
            auVar40 = vpaddd_avx2(auVar40,auVar43);
            auVar40 = vpslld_avx2(auVar40,auVar41);
            auVar40 = vpaddd_avx2(auVar40,auVar19);
            auVar40 = vpsrad_avx2(auVar40,ZEXT416(uVar4));
            auVar40 = vpaddd_avx2(auVar44,auVar40);
            if (iVar32 == 0) {
              auVar40 = vpackusdw_avx2(auVar58,auVar40);
              *(undefined1 (*) [16])((long)pCVar27 + lVar34) = auVar40._0_16_;
              *(undefined1 (*) [16])((long)pCVar37 + lVar34) = auVar40._16_16_;
            }
            else {
              auVar48._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])((long)pCVar37 + lVar34) +
                   ZEXT116(1) * *(undefined1 (*) [16])((long)pCVar27 + lVar34);
              auVar48._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * *(undefined1 (*) [16])((long)pCVar37 + lVar34);
              auVar43 = vpunpcklwd_avx2(auVar48,_DAT_005199a0);
              if (iVar26 == 0) {
                auVar58 = vpaddd_avx2(auVar58,auVar43);
                auVar58 = vpsrad_avx2(auVar58,1);
              }
              else {
                auVar15._4_4_ = iVar2;
                auVar15._0_4_ = iVar2;
                auVar15._8_4_ = iVar2;
                auVar15._12_4_ = iVar2;
                auVar15._16_4_ = iVar2;
                auVar15._20_4_ = iVar2;
                auVar15._24_4_ = iVar2;
                auVar15._28_4_ = iVar2;
                auVar43 = vpmulld_avx2(auVar43,auVar15);
                auVar12._4_4_ = iVar3;
                auVar12._0_4_ = iVar3;
                auVar12._8_4_ = iVar3;
                auVar12._12_4_ = iVar3;
                auVar12._16_4_ = iVar3;
                auVar12._20_4_ = iVar3;
                auVar12._24_4_ = iVar3;
                auVar12._28_4_ = iVar3;
                auVar58 = vpmulld_avx2(auVar58,auVar12);
                auVar58 = vpaddd_avx2(auVar58,auVar43);
                auVar58 = vpsrad_avx2(auVar58,4);
              }
              auVar43 = vpunpckhwd_avx2(auVar48,_DAT_005199a0);
              if (iVar26 == 0) {
                auVar40 = vpaddd_avx2(auVar40,auVar43);
                auVar40 = vpsrad_avx2(auVar40,1);
              }
              else {
                auVar16._4_4_ = iVar2;
                auVar16._0_4_ = iVar2;
                auVar16._8_4_ = iVar2;
                auVar16._12_4_ = iVar2;
                auVar16._16_4_ = iVar2;
                auVar16._20_4_ = iVar2;
                auVar16._24_4_ = iVar2;
                auVar16._28_4_ = iVar2;
                auVar43 = vpmulld_avx2(auVar43,auVar16);
                auVar13._4_4_ = iVar3;
                auVar13._0_4_ = iVar3;
                auVar13._8_4_ = iVar3;
                auVar13._12_4_ = iVar3;
                auVar13._16_4_ = iVar3;
                auVar13._20_4_ = iVar3;
                auVar13._24_4_ = iVar3;
                auVar13._28_4_ = iVar3;
                auVar40 = vpmulld_avx2(auVar40,auVar13);
                auVar40 = vpaddd_avx2(auVar43,auVar40);
                auVar40 = vpsrad_avx2(auVar40,4);
              }
              auVar58 = vpaddd_avx2(auVar42,auVar58);
              auVar58 = vpsrad_avx2(auVar58,ZEXT416(uVar21));
              auVar40 = vpaddd_avx2(auVar42,auVar40);
              auVar40 = vpsrad_avx2(auVar40,ZEXT416(uVar21));
              auVar40 = vpackusdw_avx2(auVar58,auVar40);
              auVar18._2_2_ = uVar35;
              auVar18._0_2_ = uVar35;
              auVar18._4_2_ = uVar35;
              auVar18._6_2_ = uVar35;
              auVar18._8_2_ = uVar35;
              auVar18._10_2_ = uVar35;
              auVar18._12_2_ = uVar35;
              auVar18._14_2_ = uVar35;
              auVar18._16_2_ = uVar35;
              auVar18._18_2_ = uVar35;
              auVar18._20_2_ = uVar35;
              auVar18._22_2_ = uVar35;
              auVar18._24_2_ = uVar35;
              auVar18._26_2_ = uVar35;
              auVar18._28_2_ = uVar35;
              auVar18._30_2_ = uVar35;
              auVar40 = vpminsw_avx2(auVar40,auVar18);
              *(undefined1 (*) [16])((long)puVar28 + lVar34) = auVar40._0_16_;
              *(undefined1 (*) [16])((long)puVar38 + lVar34) = auVar40._16_16_;
            }
          }
          in_ZMM6 = ZEXT3264(CONCAT1616(auVar6,auVar6));
          lVar23 = lVar23 + 2;
          pCVar37 = pCVar37 + lVar33 * 2;
          pCVar27 = pCVar27 + lVar33 * 2;
          puVar38 = puVar38 + lVar25 * 2;
          puVar28 = puVar28 + lVar25 * 2;
          puVar36 = puVar36 + lVar22 * 2;
          puVar20 = puVar20 + lVar22 * 2;
          auVar58 = auVar45;
          auVar40 = auVar9;
          auVar45 = auVar49;
          auVar9 = auVar47;
          auVar43 = auVar56;
        } while (lVar23 < h);
      }
      uVar31 = uVar31 + 8;
      lVar34 = lVar34 + 0x10;
    } while (uVar31 < (uint)w);
  }
  return;
}

Assistant:

void av1_highbd_dist_wtd_convolve_y_avx2(
    const uint16_t *src, int src_stride, uint16_t *dst0, int dst_stride0, int w,
    int h, const InterpFilterParams *filter_params_y, const int subpel_y_qn,
    ConvolveParams *conv_params, int bd) {
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const uint16_t *const src_ptr = src - fo_vert * src_stride;
  const int bits = FILTER_BITS - conv_params->round_0;

  assert(bits >= 0);
  int i, j;
  __m256i s[8], coeffs_y[4];
  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;

  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m256i wt0 = _mm256_set1_epi32(w0);
  const __m256i wt1 = _mm256_set1_epi32(w1);
  const __m256i round_const_y =
      _mm256_set1_epi32(((1 << conv_params->round_1) >> 1));
  const __m128i round_shift_y = _mm_cvtsi32_si128(conv_params->round_1);
  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);

  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m256i offset_const = _mm256_set1_epi32(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m256i rounding_const = _mm256_set1_epi32((1 << rounding_shift) >> 1);
  const __m256i clip_pixel_to_bd =
      _mm256_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));
  const __m256i zero = _mm256_setzero_si256();

  prepare_coeffs(filter_params_y, subpel_y_qn, coeffs_y);

  for (j = 0; j < w; j += 8) {
    const uint16_t *data = &src_ptr[j];
    /* Vertical filter */
    {
      __m256i src6;
      __m256i s01 = _mm256_permute2x128_si256(
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 0 * src_stride))),
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 1 * src_stride))),
          0x20);
      __m256i s12 = _mm256_permute2x128_si256(
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 1 * src_stride))),
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 2 * src_stride))),
          0x20);
      __m256i s23 = _mm256_permute2x128_si256(
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 2 * src_stride))),
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 3 * src_stride))),
          0x20);
      __m256i s34 = _mm256_permute2x128_si256(
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 3 * src_stride))),
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 4 * src_stride))),
          0x20);
      __m256i s45 = _mm256_permute2x128_si256(
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 4 * src_stride))),
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 5 * src_stride))),
          0x20);
      src6 = _mm256_castsi128_si256(
          _mm_loadu_si128((__m128i *)(data + 6 * src_stride)));
      __m256i s56 = _mm256_permute2x128_si256(
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 5 * src_stride))),
          src6, 0x20);

      s[0] = _mm256_unpacklo_epi16(s01, s12);
      s[1] = _mm256_unpacklo_epi16(s23, s34);
      s[2] = _mm256_unpacklo_epi16(s45, s56);

      s[4] = _mm256_unpackhi_epi16(s01, s12);
      s[5] = _mm256_unpackhi_epi16(s23, s34);
      s[6] = _mm256_unpackhi_epi16(s45, s56);

      for (i = 0; i < h; i += 2) {
        data = &src_ptr[i * src_stride + j];

        const __m256i s67 = _mm256_permute2x128_si256(
            src6,
            _mm256_castsi128_si256(
                _mm_loadu_si128((__m128i *)(data + 7 * src_stride))),
            0x20);

        src6 = _mm256_castsi128_si256(
            _mm_loadu_si128((__m128i *)(data + 8 * src_stride)));

        const __m256i s78 = _mm256_permute2x128_si256(
            _mm256_castsi128_si256(
                _mm_loadu_si128((__m128i *)(data + 7 * src_stride))),
            src6, 0x20);

        s[3] = _mm256_unpacklo_epi16(s67, s78);
        s[7] = _mm256_unpackhi_epi16(s67, s78);

        const __m256i res_a = convolve(s, coeffs_y);

        __m256i res_a_round = _mm256_sll_epi32(res_a, round_shift_bits);
        res_a_round = _mm256_sra_epi32(
            _mm256_add_epi32(res_a_round, round_const_y), round_shift_y);

        __m256i res_unsigned_lo = _mm256_add_epi32(res_a_round, offset_const);

        if (w - j < 8) {
          if (do_average) {
            const __m256i data_0 = _mm256_castsi128_si256(
                _mm_loadl_epi64((__m128i *)(&dst[i * dst_stride + j])));
            const __m256i data_1 = _mm256_castsi128_si256(_mm_loadl_epi64(
                (__m128i *)(&dst[i * dst_stride + j + dst_stride])));
            const __m256i data_01 =
                _mm256_permute2x128_si256(data_0, data_1, 0x20);

            const __m256i data_ref_0 = _mm256_unpacklo_epi16(data_01, zero);

            const __m256i comp_avg_res =
                highbd_comp_avg(&data_ref_0, &res_unsigned_lo, &wt0, &wt1,
                                use_dist_wtd_comp_avg);

            const __m256i round_result = highbd_convolve_rounding(
                &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

            const __m256i res_16b =
                _mm256_packus_epi32(round_result, round_result);
            const __m256i res_clip =
                _mm256_min_epi16(res_16b, clip_pixel_to_bd);

            const __m128i res_0 = _mm256_castsi256_si128(res_clip);
            const __m128i res_1 = _mm256_extracti128_si256(res_clip, 1);

            _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
            _mm_storel_epi64(
                (__m128i *)(&dst0[i * dst_stride0 + j + dst_stride0]), res_1);
          } else {
            __m256i res_16b =
                _mm256_packus_epi32(res_unsigned_lo, res_unsigned_lo);
            const __m128i res_0 = _mm256_castsi256_si128(res_16b);
            const __m128i res_1 = _mm256_extracti128_si256(res_16b, 1);

            _mm_storel_epi64((__m128i *)(&dst[i * dst_stride + j]), res_0);
            _mm_storel_epi64((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                             res_1);
          }
        } else {
          const __m256i res_b = convolve(s + 4, coeffs_y);
          __m256i res_b_round = _mm256_sll_epi32(res_b, round_shift_bits);
          res_b_round = _mm256_sra_epi32(
              _mm256_add_epi32(res_b_round, round_const_y), round_shift_y);

          __m256i res_unsigned_hi = _mm256_add_epi32(res_b_round, offset_const);

          if (do_average) {
            const __m256i data_0 = _mm256_castsi128_si256(
                _mm_loadu_si128((__m128i *)(&dst[i * dst_stride + j])));
            const __m256i data_1 = _mm256_castsi128_si256(_mm_loadu_si128(
                (__m128i *)(&dst[i * dst_stride + j + dst_stride])));
            const __m256i data_01 =
                _mm256_permute2x128_si256(data_0, data_1, 0x20);

            const __m256i data_ref_0_lo = _mm256_unpacklo_epi16(data_01, zero);
            const __m256i data_ref_0_hi = _mm256_unpackhi_epi16(data_01, zero);

            const __m256i comp_avg_res_lo =
                highbd_comp_avg(&data_ref_0_lo, &res_unsigned_lo, &wt0, &wt1,
                                use_dist_wtd_comp_avg);
            const __m256i comp_avg_res_hi =
                highbd_comp_avg(&data_ref_0_hi, &res_unsigned_hi, &wt0, &wt1,
                                use_dist_wtd_comp_avg);

            const __m256i round_result_lo =
                highbd_convolve_rounding(&comp_avg_res_lo, &offset_const,
                                         &rounding_const, rounding_shift);
            const __m256i round_result_hi =
                highbd_convolve_rounding(&comp_avg_res_hi, &offset_const,
                                         &rounding_const, rounding_shift);

            const __m256i res_16b =
                _mm256_packus_epi32(round_result_lo, round_result_hi);
            const __m256i res_clip =
                _mm256_min_epi16(res_16b, clip_pixel_to_bd);

            const __m128i res_0 = _mm256_castsi256_si128(res_clip);
            const __m128i res_1 = _mm256_extracti128_si256(res_clip, 1);

            _mm_store_si128((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
            _mm_store_si128(
                (__m128i *)(&dst0[i * dst_stride0 + j + dst_stride0]), res_1);
          } else {
            __m256i res_16b =
                _mm256_packus_epi32(res_unsigned_lo, res_unsigned_hi);
            const __m128i res_0 = _mm256_castsi256_si128(res_16b);
            const __m128i res_1 = _mm256_extracti128_si256(res_16b, 1);

            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_0);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                            res_1);
          }
        }
        s[0] = s[1];
        s[1] = s[2];
        s[2] = s[3];

        s[4] = s[5];
        s[5] = s[6];
        s[6] = s[7];
      }
    }
  }
}